

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)5>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  cell *value;
  
  std::_Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  _Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&frame->expressions,
             (_Vector_impl_data *)&frame->resolved_arguments);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::clear
            (&frame->resolved_arguments);
  value = (frame->expressions).
          super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ._M_impl.super__Vector_impl_data._M_start;
  (frame->exp_it)._M_current = value;
  SchemeFrame::setExpression(frame,value);
  return false;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		// Update expressions to call list
		frame.expressions.swap(frame.resolved_arguments);
		frame.resolved_arguments.clear();
		frame.exp_it = frame.expressions.cbegin();
		frame.setExpression(*frame.exp_it);
		// Don't move exp_it
		return false;
	}